

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMimeMagicRuleMatcher>::copyAppend
          (QGenericArrayOps<QMimeMagicRuleMatcher> *this,QMimeMagicRuleMatcher *b,
          QMimeMagicRuleMatcher *e)

{
  QMimeMagicRuleMatcher *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QMimeMagicRuleMatcher>).ptr;
    lVar4 = (this->super_QArrayDataPointer<QMimeMagicRuleMatcher>).size;
    do {
      pDVar2 = (b->m_list).d.d;
      pQVar1[lVar4].m_list.d.d = pDVar2;
      pQVar1[lVar4].m_list.d.ptr = (b->m_list).d.ptr;
      pQVar1[lVar4].m_list.d.size = (b->m_list).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      pQVar1[lVar4].m_priority = b->m_priority;
      pDVar3 = (b->m_mimetype).d.d;
      pQVar1[lVar4].m_mimetype.d.d = pDVar3;
      pQVar1[lVar4].m_mimetype.d.ptr = (b->m_mimetype).d.ptr;
      pQVar1[lVar4].m_mimetype.d.size = (b->m_mimetype).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<QMimeMagicRuleMatcher>).size + 1;
      (this->super_QArrayDataPointer<QMimeMagicRuleMatcher>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }